

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t httplib::detail::write_headers(Stream *strm,Headers *headers)

{
  ssize_t sVar1;
  ssize_t sVar2;
  char **in_RCX;
  void *in_RDX;
  long lVar3;
  _Base_ptr p_Var4;
  undefined1 auVar5 [16];
  char *local_40;
  char *local_38;
  
  p_Var4 = (headers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar3 = 0;
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 == &(headers->_M_t)._M_impl.super__Rb_tree_header) {
      sVar2 = Stream::write(strm,0x14740a,in_RDX,(size_t)in_RCX);
      if (sVar2 < 0) {
        lVar3 = 0;
      }
      return lVar3 + sVar2;
    }
    local_38 = *(char **)(p_Var4 + 1);
    local_40 = *(char **)(p_Var4 + 2);
    in_RCX = &local_40;
    sVar1 = Stream::write_format<char_const*,char_const*>(strm,"%s: %s\r\n",&local_38,&local_40);
    if (sVar1 < 0) break;
    lVar3 = lVar3 + sVar1;
    auVar5 = std::_Rb_tree_increment(p_Var4);
    in_RDX = auVar5._8_8_;
    p_Var4 = auVar5._0_8_;
  }
  return sVar1;
}

Assistant:

inline ssize_t write_headers(Stream &strm, const Headers &headers) {
  ssize_t write_len = 0;
  for (const auto &x : headers) {
    auto len =
        strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
    if (len < 0) { return len; }
    write_len += len;
  }
  auto len = strm.write("\r\n");
  if (len < 0) { return len; }
  write_len += len;
  return write_len;
}